

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window.cxx
# Opt level: O3

void __thiscall Fl_Window::icons(Fl_Window *this,Fl_RGB_Image **icons,int count)

{
  icon_data *piVar1;
  Fl_RGB_Image *pFVar2;
  int iVar3;
  void *pvVar4;
  undefined4 extraout_var;
  int i;
  ulong uVar5;
  
  free_icons(this);
  if (0 < count) {
    pvVar4 = operator_new__((ulong)(uint)count * 8);
    piVar1 = this->icon_;
    *(void **)(piVar1 + 8) = pvVar4;
    *(int *)(piVar1 + 0x10) = count;
    uVar5 = 0;
    do {
      pFVar2 = icons[uVar5];
      iVar3 = (*(pFVar2->super_Fl_Image)._vptr_Fl_Image[2])
                        (pFVar2,(ulong)(uint)(pFVar2->super_Fl_Image).w_,
                         (ulong)(uint)(pFVar2->super_Fl_Image).h_);
      *(ulong *)(*(long *)(this->icon_ + 8) + uVar5 * 8) = CONCAT44(extraout_var,iVar3);
      uVar5 = uVar5 + 1;
    } while ((uint)count != uVar5);
  }
  if (this->i != (Fl_X *)0x0) {
    Fl_X::set_icons(this->i);
    return;
  }
  return;
}

Assistant:

void Fl_Window::icons(const Fl_RGB_Image *icons[], int count) {
  free_icons();

  if (count > 0) {
    icon_->icons = new Fl_RGB_Image*[count];
    icon_->count = count;
    // FIXME: Fl_RGB_Image lacks const modifiers on methods
    for (int i = 0;i < count;i++)
      icon_->icons[i] = (Fl_RGB_Image*)((Fl_RGB_Image*)icons[i])->copy();
  }

  if (i)
    i->set_icons();
}